

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::deinit(FunctionalTest16 *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar4;
  long lVar5;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (this->m_fs_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_fs_ids[lVar5] = 0;
    }
    if (this->m_fs_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_fs_po_ids[lVar5] = 0;
    }
    if (this->m_gs_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_gs_ids[lVar5] = 0;
    }
    if (this->m_gs_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_gs_po_ids[lVar5] = 0;
    }
    if (this->m_pipeline_object_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x450))(1,this->m_pipeline_object_ids + lVar5);
    }
    if (this->m_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_po_ids[lVar5] = 0;
    }
    if (this->m_tc_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tc_ids[lVar5] = 0;
    }
    if (this->m_tc_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_tc_po_ids[lVar5] = 0;
    }
    if (this->m_te_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_te_ids[lVar5] = 0;
    }
    if (this->m_te_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_te_po_ids[lVar5] = 0;
    }
    if (this->m_vs_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_vs_ids[lVar5] = 0;
    }
    if (this->m_vs_po_ids[lVar5] != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_vs_po_ids[lVar5] = 0;
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  return;
}

Assistant:

void FunctionalTest16::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_id = 0; n_id < 2; ++n_id)
	{
		if (m_fs_ids[n_id] != 0)
		{
			gl.deleteShader(m_fs_ids[n_id]);

			m_fs_ids[n_id] = 0;
		}

		if (m_fs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_fs_po_ids[n_id]);

			m_fs_po_ids[n_id] = 0;
		}

		if (m_gs_ids[n_id] != 0)
		{
			gl.deleteShader(m_gs_ids[n_id]);

			m_gs_ids[n_id] = 0;
		}

		if (m_gs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_gs_po_ids[n_id]);

			m_gs_po_ids[n_id] = 0;
		}

		if (m_pipeline_object_ids[n_id] != 0)
		{
			gl.deleteProgramPipelines(1 /* n */, m_pipeline_object_ids + n_id);
		}

		if (m_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_po_ids[n_id]);

			m_po_ids[n_id] = 0;
		}

		if (m_tc_ids[n_id] != 0)
		{
			gl.deleteShader(m_tc_ids[n_id]);

			m_tc_ids[n_id] = 0;
		}

		if (m_tc_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_tc_po_ids[n_id]);

			m_tc_po_ids[n_id] = 0;
		}

		if (m_te_ids[n_id] != 0)
		{
			gl.deleteShader(m_te_ids[n_id]);

			m_te_ids[n_id] = 0;
		}

		if (m_te_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_te_po_ids[n_id]);

			m_te_po_ids[n_id] = 0;
		}

		if (m_vs_ids[n_id] != 0)
		{
			gl.deleteShader(m_vs_ids[n_id]);

			m_vs_ids[n_id] = 0;
		}

		if (m_vs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_vs_po_ids[n_id]);

			m_vs_po_ids[n_id] = 0;
		}
	} /* for (both IDs) */
}